

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O3

void Curl_client_reset(Curl_easy *data)

{
  curl_trc_feat *pcVar1;
  Curl_creader *pCVar2;
  Curl_cwriter *pCVar3;
  uint uVar4;
  
  uVar4 = (uint)*(undefined8 *)&(data->set).field_0x8ca;
  if (((data->req).field_0xd9 & 0x80) == 0) {
    if ((((uVar4 >> 0x1c & 1) != 0) &&
        ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level))))
       && (0 < Curl_trc_feat_read.log_level)) {
      Curl_trc_read(data,"client_reset, clear readers");
    }
    pCVar2 = (data->req).reader_stack;
    while (pCVar2 != (Curl_creader *)0x0) {
      (data->req).reader_stack = pCVar2->next;
      (*pCVar2->crt->do_close)(data,pCVar2);
      (*Curl_cfree)(pCVar2);
      pCVar2 = (data->req).reader_stack;
    }
  }
  else if (((uVar4 >> 0x1c & 1) != 0) &&
          (((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level))
           && (0 < Curl_trc_feat_read.log_level)))) {
    Curl_trc_read(data,"client_reset, will rewind reader");
  }
  pCVar3 = (data->req).writer_stack;
  while (pCVar3 != (Curl_cwriter *)0x0) {
    (data->req).writer_stack = pCVar3->next;
    (*pCVar3->cwt->do_close)(data,pCVar3);
    (*Curl_cfree)(pCVar3);
    pCVar3 = (data->req).writer_stack;
  }
  (data->req).bytecount = 0;
  (data->req).headerline = 0;
  return;
}

Assistant:

void Curl_client_reset(struct Curl_easy *data)
{
  if(data->req.rewind_read) {
    /* already requested */
    CURL_TRC_READ(data, "client_reset, will rewind reader");
  }
  else {
    CURL_TRC_READ(data, "client_reset, clear readers");
    cl_reset_reader(data);
  }
  cl_reset_writer(data);

  data->req.bytecount = 0;
  data->req.headerline = 0;
}